

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::ScalarType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,BaseType type)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  int iVar1;
  
  iVar1 = (int)this;
  if (iVar1 == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bool","");
    return extraout_RAX;
  }
  if (iVar1 - 1U < 10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"int","");
    return extraout_RAX_00;
  }
  if (iVar1 - 0xbU < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"float","");
    return extraout_RAX_01;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                ,0xa4,
                "static std::string flatbuffers::python::(anonymous namespace)::PythonStubGenerator::ScalarType(BaseType)"
               );
}

Assistant:

inline bool IsBool   (BaseType t) { return t == BASE_TYPE_BOOL; }